

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O2

void __thiscall
google::protobuf::Reflection::UnsafeArenaSwapFields
          (Reflection *this,Message *lhs,Message *rhs,
          vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          *fields)

{
  string *psVar1;
  Arena *local_38 [2];
  Arena *local_28;
  
  local_38[0] = (Arena *)(lhs->super_MessageLite)._internal_metadata_.ptr_;
  if (((ulong)local_38[0] & 1) != 0) {
    local_38[0] = *(Arena **)((ulong)local_38[0] & 0xfffffffffffffffe);
  }
  local_28 = (Arena *)(rhs->super_MessageLite)._internal_metadata_.ptr_;
  if (((ulong)local_28 & 1) != 0) {
    local_28 = *(Arena **)((ulong)local_28 & 0xfffffffffffffffe);
  }
  psVar1 = absl::lts_20240722::log_internal::
           Check_EQImpl<google::protobuf::Arena*,google::protobuf::Arena*>
                     (local_38,&local_28,"lhs->GetArena() == rhs->GetArena()");
  if (psVar1 == (string *)0x0) {
    UnsafeShallowSwapFields(this,lhs,rhs,fields);
    return;
  }
  absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)local_38,
             "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/generated_message_reflection.cc"
             ,0x4c1,psVar1->_M_string_length,(psVar1->_M_dataplus)._M_p);
  absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_38);
}

Assistant:

void Reflection::UnsafeArenaSwapFields(
    Message* lhs, Message* rhs,
    const std::vector<const FieldDescriptor*>& fields) const {
  ABSL_DCHECK_EQ(lhs->GetArena(), rhs->GetArena());
  UnsafeShallowSwapFields(lhs, rhs, fields);
}